

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O0

void __thiscall
mocker::ir::BuilderContext::BuilderContext
          (BuilderContext *this,ASTIDMap<std::shared_ptr<mocker::ast::Type>_> *exprType,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *doNotTranslate)

{
  FunctionModule *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  allocator<char> local_159;
  string local_158;
  FunctionModule local_138;
  allocator<char> local_59;
  string local_58;
  FunctionModule *local_38;
  FunctionModule *initGlobalVars;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *local_20;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *doNotTranslate_local;
  ASTIDMap<std::shared_ptr<mocker::ast::Type>_> *exprType_local;
  BuilderContext *this_local;
  
  local_20 = doNotTranslate;
  doNotTranslate_local =
       (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
        *)exprType;
  exprType_local = (ASTIDMap<std::shared_ptr<mocker::ast::Type>_> *)this;
  LogicalExprInfo::LogicalExprInfo(&this->logicalExprInfo);
  std::
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ir::Addr>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  ::unordered_map(&this->exprAddr);
  this->exprType = (ASTIDMap<std::shared_ptr<ast::Type>_> *)doNotTranslate_local;
  std::
  unordered_map<unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<mocker::ir::BasicBlock>_>_>_>
  ::unordered_map(&this->bbReside);
  std::
  stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
  ::
  stack<std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>,void>
            ((stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
              *)&this->loopEntry);
  std::
  stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
  ::
  stack<std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>,void>
            ((stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
              *)&this->loopSuccessor);
  std::
  stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
  ::
  stack<std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>,void>
            ((stack<std::shared_ptr<mocker::ir::Label>,std::deque<std::shared_ptr<mocker::ir::Label>,std::allocator<std::shared_ptr<mocker::ir::Label>>>>
              *)&this->loopUpdate);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::BuilderContext::ClassLayout,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::BuilderContext::ClassLayout>_>_>
  ::unordered_map(&this->classLayout);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
  ::unordered_map(&this->strLits);
  std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::unordered_set(&this->trivialExpr);
  Module::Module(&this->module);
  this->strLitCounter = 0;
  std::_List_iterator<mocker::ir::BasicBlock>::_List_iterator(&this->curBasicBlock);
  this->curFunc = (FunctionModule *)0x0;
  this->doNotTranslate = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"_init_global_vars",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"_init_global_vars",&local_159);
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_178);
  FunctionModule::FunctionModule(&local_138,&local_158,&local_178,false);
  this_00 = Module::addFunc(&this->module,&local_58,&local_138);
  FunctionModule::~FunctionModule(&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = this_00;
  FunctionModule::pushBackBB(this_00);
  return;
}

Assistant:

BuilderContext(const ASTIDMap<std::shared_ptr<mocker::ast::Type>> &exprType,
                 const std::unordered_set<ast::NodeID> &doNotTranslate)
      : exprType(exprType), doNotTranslate(doNotTranslate) {
    auto &initGlobalVars = module.addFunc(
        "_init_global_vars", FunctionModule{"_init_global_vars", {}});
    initGlobalVars.pushBackBB();
  }